

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O0

void __thiscall
ezc3d::c3d::analog(c3d *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *chanNames,
                  vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_> *frames)

{
  int iVar1;
  size_type sVar2;
  size_t sVar3;
  invalid_argument *piVar4;
  Header *pHVar5;
  size_t sVar6;
  const_reference pvVar7;
  SubFrame *this_00;
  SubFrame *channel;
  vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_> *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  c3d *in_stack_000000c8;
  size_t sf;
  size_t f;
  size_t i;
  size_t idx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *labels;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00001d20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00001d28;
  c3d *in_stack_00001d30;
  Analogs *in_stack_fffffffffffffee0;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  pointer in_stack_ffffffffffffffb8;
  pointer in_stack_ffffffffffffffc0;
  
  sVar2 = std::vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>::size(in_RDX);
  data((c3d *)0x14e4c1);
  sVar3 = DataNS::Data::nbFrames((Data *)0x14e4c9);
  if (sVar2 != sVar3) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,
               "Size of the array of frames must equal the number of frames already present in the data set"
              );
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>::operator[](in_RDX,0);
  DataNS::Frame::analogs((Frame *)0x14e559);
  sVar3 = DataNS::AnalogsNS::Analogs::nbSubframes((Analogs *)0x14e561);
  pHVar5 = header((c3d *)0x14e576);
  sVar6 = Header::nbAnalogByFrame(pHVar5);
  if (sVar3 != sVar6) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,
               "Size of the subframes in the frames must equal the number of subframes already present in the data set"
              );
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>::operator[](in_RDX,0);
  DataNS::Frame::analogs((Frame *)0x14e60e);
  DataNS::AnalogsNS::Analogs::subframe
            ((Analogs *)in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
  sVar3 = DataNS::AnalogsNS::SubFrame::nbChannels((SubFrame *)0x14e622);
  if (sVar3 == 0) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Channels in the frame cannot be empty");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  channelNames_abi_cxx11_(in_stack_000000c8);
  local_50 = 0;
  do {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RSI);
    if (sVar2 <= local_50) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x14e9d0);
      updateParameters(in_stack_00001d30,in_stack_00001d28,in_stack_00001d20);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffee0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffee0);
      return;
    }
    local_58 = 0;
    while( true ) {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xffffffffffffffb8);
      if (sVar2 <= local_58) break;
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](in_RSI,local_50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffffb8,local_58);
      iVar1 = std::__cxx11::string::compare((string *)pvVar7);
      if (iVar1 == 0) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument
                  (piVar4,"The channel you try to create already exists in the data set");
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      local_58 = local_58 + 1;
    }
    local_60 = 0;
    while( true ) {
      data((c3d *)0x14e82a);
      sVar3 = DataNS::Data::nbFrames((Data *)0x14e832);
      if (sVar3 <= local_60) break;
      local_68 = 0;
      while( true ) {
        pHVar5 = header((c3d *)0x14e872);
        sVar3 = Header::nbAnalogByFrame(pHVar5);
        if (sVar3 <= local_68) break;
        std::__shared_ptr_access<ezc3d::DataNS::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<ezc3d::DataNS::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x14e8a8);
        DataNS::Data::frame((Data *)in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
        this_00 = (SubFrame *)DataNS::Frame::analogs((Frame *)0x14e8c9);
        channel = DataNS::AnalogsNS::Analogs::subframe
                            ((Analogs *)in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8)
        ;
        std::vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>::operator[]
                  (in_RDX,local_60);
        in_stack_fffffffffffffee0 = DataNS::Frame::analogs((Frame *)0x14e906);
        DataNS::AnalogsNS::Analogs::subframe
                  ((Analogs *)in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
        DataNS::AnalogsNS::SubFrame::channel
                  ((SubFrame *)in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8);
        DataNS::AnalogsNS::SubFrame::channel
                  (this_00,(Channel *)channel,(size_t)in_stack_fffffffffffffee0);
        local_68 = local_68 + 1;
      }
      local_60 = local_60 + 1;
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

void ezc3d::c3d::analog(const std::vector<std::string> &chanNames,
                        const std::vector<ezc3d::DataNS::Frame> &frames) {
  if (frames.size() != data().nbFrames())
    throw std::invalid_argument(
        "Size of the array of frames must equal the number of "
        "frames already present in the data set");
  if (frames[0].analogs().nbSubframes() != header().nbAnalogByFrame())
    throw std::invalid_argument(
        "Size of the subframes in the frames must equal the "
        "number of subframes already present in the data set");
  if (frames[0].analogs().subframe(0).nbChannels() == 0)
    throw std::invalid_argument("Channels in the frame cannot be empty");

  const std::vector<std::string> &labels(channelNames());
  for (size_t idx = 0; idx < chanNames.size(); ++idx) {
    for (size_t i = 0; i < labels.size(); ++i)
      if (!chanNames[idx].compare(labels[i]))
        throw std::invalid_argument("The channel you try to create already "
                                    "exists in the data set");

    for (size_t f = 0; f < data().nbFrames(); ++f) {
      for (size_t sf = 0; sf < header().nbAnalogByFrame(); ++sf) {
        _data->frame(f).analogs().subframe(sf).channel(
            frames[f].analogs().subframe(sf).channel(idx));
      }
    }
  }
  updateParameters({}, chanNames);
}